

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextGLImpl::SetPipelineState
          (DeviceContextGLImpl *this,IPipelineState *pPipelineState)

{
  GLContextState *this_00;
  float fVar1;
  PIPELINE_TYPE PipelineType;
  PipelineStateGLImpl *this_01;
  GraphicsPipelineData *GraphicsPipeline;
  bool bVar2;
  Uint32 RenderTargetMask;
  GraphicsPipelineDesc *BSDsc;
  char (*in_R9) [29];
  Uint32 DvpCompatibleSRBCount;
  string local_40;
  char *local_20;
  
  bVar2 = DeviceContextBase<Diligent::EngineGLImplTraits>::SetPipelineState
                    (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pPipelineState,
                     (INTERFACE_ID *)PipelineStateGLImpl::IID_InternalImpl);
  if (bVar2) {
    this_01 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
              m_pObject;
    PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
              (&this_01->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    PipelineType = (this_01->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                   .m_Desc.PipelineType;
    if (PipelineType != PIPELINE_TYPE_COMPUTE) {
      if (PipelineType != PIPELINE_TYPE_GRAPHICS) {
        local_20 = GetPipelineTypeString(PipelineType);
        FormatString<char_const*,char[12],char_const*,char[29]>
                  (&local_40,(Diligent *)&local_20,(char **)0x82b6d3,
                   (char (*) [12])
                   &(this_01->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' is not supported in OpenGL",in_R9);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)
                    (2,CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_),0,0
                     ,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_) ==
            &local_40.field_2) {
          return;
        }
        operator_delete((undefined1 *)
                        CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_),
                        local_40.field_2._M_allocated_capacity + 1);
        return;
      }
      BSDsc = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                        (&((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pPipelineState.m_pObject)->
                          super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      this_00 = &this->m_ContextState;
      GLContextState::SetFillMode(this_00,(BSDsc->RasterizerDesc).FillMode);
      GLContextState::SetCullMode(this_00,(BSDsc->RasterizerDesc).CullMode);
      GLContextState::SetFrontFace(this_00,(BSDsc->RasterizerDesc).FrontCounterClockwise);
      GLContextState::SetDepthBias
                (this_00,(float)(BSDsc->RasterizerDesc).DepthBias,
                 (float)(BSDsc->RasterizerDesc).SlopeScaledDepthBias);
      fVar1 = (float)(BSDsc->RasterizerDesc).DepthBiasClamp;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        FormatString<char[44]>
                  (&local_40,(char (*) [44])"Depth bias clamp is not supported on OpenGL");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)
                    (1,CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_),0,0
                     ,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_) !=
            &local_40.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_),
                          local_40.field_2._M_allocated_capacity + 1);
        }
      }
      GLContextState::SetDepthClamp(this_00,(bool)((BSDsc->RasterizerDesc).DepthClipEnable ^ 1));
      GLContextState::EnableScissorTest(this_00,(BSDsc->RasterizerDesc).ScissorEnable);
      if ((BSDsc->RasterizerDesc).AntialiasedLineEnable == true) {
        FormatString<char[45]>
                  (&local_40,(char (*) [45])"Line antialiasing is not supported on OpenGL");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)
                    (1,CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_),0,0
                     ,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_) !=
            &local_40.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_40._M_dataplus._M_p._4_4_,local_40._M_dataplus._M_p._0_4_),
                          local_40.field_2._M_allocated_capacity + 1);
        }
      }
      GraphicsPipeline =
           (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
            m_pObject)->super_PipelineStateBase<Diligent::EngineGLImplTraits>).field_6.
           m_pGraphicsPipelineData;
      if (GraphicsPipeline == (GraphicsPipelineData *)0x0) {
        RenderTargetMask = 0;
      }
      else {
        RenderTargetMask = PipelineStateUtils::GetRenderTargetMask(&GraphicsPipeline->Desc);
      }
      GLContextState::SetBlendState(this_00,&BSDsc->BlendDesc,RenderTargetMask,BSDsc->SampleMask);
      GLContextState::EnableDepthTest(this_00,(BSDsc->DepthStencilDesc).DepthEnable);
      GLContextState::EnableDepthWrites(this_00,(BSDsc->DepthStencilDesc).DepthWriteEnable);
      GLContextState::SetDepthFunc(this_00,(BSDsc->DepthStencilDesc).DepthFunc);
      GLContextState::EnableStencilTest(this_00,(BSDsc->DepthStencilDesc).StencilEnable);
      GLContextState::SetStencilWriteMask(this_00,(BSDsc->DepthStencilDesc).StencilWriteMask);
      GLContextState::SetStencilFunc
                (this_00,0x404,(BSDsc->DepthStencilDesc).FrontFace.StencilFunc,
                 (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_StencilRef,
                 (uint)(BSDsc->DepthStencilDesc).StencilReadMask);
      GLContextState::SetStencilOp
                (this_00,0x404,(BSDsc->DepthStencilDesc).FrontFace.StencilFailOp,
                 (BSDsc->DepthStencilDesc).FrontFace.StencilDepthFailOp,
                 (BSDsc->DepthStencilDesc).FrontFace.StencilPassOp);
      GLContextState::SetStencilFunc
                (this_00,0x405,(BSDsc->DepthStencilDesc).BackFace.StencilFunc,
                 (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_StencilRef,
                 (uint)(BSDsc->DepthStencilDesc).StencilReadMask);
      GLContextState::SetStencilOp
                (this_00,0x405,(BSDsc->DepthStencilDesc).BackFace.StencilFailOp,
                 (BSDsc->DepthStencilDesc).BackFace.StencilDepthFailOp,
                 (BSDsc->DepthStencilDesc).BackFace.StencilPassOp);
      (this->m_ContextState).m_VAOId = -1;
      this->m_DrawBuffersCommitted = false;
    }
    PipelineStateGLImpl::CommitProgram
              ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
               m_pObject,&this->m_ContextState);
    local_40._M_dataplus._M_p._0_4_ = 0;
    DeviceContextBase<Diligent::EngineGLImplTraits>::PrepareCommittedResources
              (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,
               &(this->m_BindInfo).super_CommittedShaderResources,(Uint32 *)&local_40);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::SetPipelineState(IPipelineState* pPipelineState)
{
    if (!TDeviceContextBase::SetPipelineState(pPipelineState, PipelineStateGLImpl::IID_InternalImpl))
        return;

    const PipelineStateDesc& Desc = m_pPipelineState->GetDesc();
    if (Desc.PipelineType == PIPELINE_TYPE_COMPUTE)
    {
    }
    else if (Desc.PipelineType == PIPELINE_TYPE_GRAPHICS)
    {
        const GraphicsPipelineDesc& GraphicsPipeline = m_pPipelineState->GetGraphicsPipelineDesc();
        // Set rasterizer state
        {
            const RasterizerStateDesc& RasterizerDesc = GraphicsPipeline.RasterizerDesc;

            m_ContextState.SetFillMode(RasterizerDesc.FillMode);
            m_ContextState.SetCullMode(RasterizerDesc.CullMode);
            m_ContextState.SetFrontFace(RasterizerDesc.FrontCounterClockwise);
            m_ContextState.SetDepthBias(static_cast<Float32>(RasterizerDesc.DepthBias), RasterizerDesc.SlopeScaledDepthBias);
            if (RasterizerDesc.DepthBiasClamp != 0)
                LOG_WARNING_MESSAGE("Depth bias clamp is not supported on OpenGL");

            // Enabling depth clamping in GL is the same as disabling clipping in Direct3D.
            // https://docs.microsoft.com/en-us/windows/win32/api/d3d11/ns-d3d11-d3d11_rasterizer_desc
            // https://www.khronos.org/opengl/wiki/GLAPI/glEnable
            m_ContextState.SetDepthClamp(!RasterizerDesc.DepthClipEnable);

            m_ContextState.EnableScissorTest(RasterizerDesc.ScissorEnable);
            if (RasterizerDesc.AntialiasedLineEnable)
                LOG_WARNING_MESSAGE("Line antialiasing is not supported on OpenGL");
        }

        // Set blend state
        {
            const BlendStateDesc& BSDsc = GraphicsPipeline.BlendDesc;
            m_ContextState.SetBlendState(BSDsc, m_pPipelineState->GetRenderTargetMask(), GraphicsPipeline.SampleMask);
        }

        // Set depth-stencil state
        {
            const DepthStencilStateDesc& DepthStencilDesc = GraphicsPipeline.DepthStencilDesc;

            m_ContextState.EnableDepthTest(DepthStencilDesc.DepthEnable);
            m_ContextState.EnableDepthWrites(DepthStencilDesc.DepthWriteEnable);
            m_ContextState.SetDepthFunc(DepthStencilDesc.DepthFunc);
            m_ContextState.EnableStencilTest(DepthStencilDesc.StencilEnable);
            m_ContextState.SetStencilWriteMask(DepthStencilDesc.StencilWriteMask);

            {
                const StencilOpDesc& FrontFace = DepthStencilDesc.FrontFace;
                m_ContextState.SetStencilFunc(GL_FRONT, FrontFace.StencilFunc, m_StencilRef, DepthStencilDesc.StencilReadMask);
                m_ContextState.SetStencilOp(GL_FRONT, FrontFace.StencilFailOp, FrontFace.StencilDepthFailOp, FrontFace.StencilPassOp);
            }

            {
                const StencilOpDesc& BackFace = DepthStencilDesc.BackFace;
                m_ContextState.SetStencilFunc(GL_BACK, BackFace.StencilFunc, m_StencilRef, DepthStencilDesc.StencilReadMask);
                m_ContextState.SetStencilOp(GL_BACK, BackFace.StencilFailOp, BackFace.StencilDepthFailOp, BackFace.StencilPassOp);
            }
        }
        m_ContextState.InvalidateVAO();
        m_DrawBuffersCommitted = false;
    }
    else
    {
        LOG_ERROR_MESSAGE(GetPipelineTypeString(Desc.PipelineType), " pipeline '", Desc.Name, "' is not supported in OpenGL");
        return;
    }

    // Note that the program may change if a shader is created after the call
    // (ShaderResourcesGL needs to bind a program to load uniforms), but before
    // the draw command.
    m_pPipelineState->CommitProgram(m_ContextState);

    Uint32 DvpCompatibleSRBCount = 0;
    PrepareCommittedResources(m_BindInfo, DvpCompatibleSRBCount);
}